

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O2

void __thiscall cmInstallScriptGenerator::~cmInstallScriptGenerator(cmInstallScriptGenerator *this)

{
  ~cmInstallScriptGenerator(this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

cmInstallScriptGenerator
::~cmInstallScriptGenerator()
{
}